

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindowPrivate::updateCursor(QMdiSubWindowPrivate *this)

{
  QWidget *this_00;
  bool bVar1;
  QStyle *style;
  iterator iVar2;
  long in_FS_OFFSET;
  QCursor QStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  style = QWidget::style(this_00);
  bVar1 = isMacStyle(style);
  if (!bVar1) {
    if (this->currentOperation != Move) {
      if (this->currentOperation == None) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          QWidget::unsetCursor(this_00);
          return;
        }
        goto LAB_00416c1a;
      }
      iVar2 = QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::find
                        (&this->operationMap,&this->currentOperation);
      if (*(char *)((long)iVar2.i._M_node + 0x38) != '\x01') goto LAB_00416c00;
    }
    iVar2 = QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::find
                      (&this->operationMap,&this->currentOperation);
    QCursor::QCursor(&QStack_28,*(CursorShape *)((long)iVar2.i._M_node + 0x2c));
    QWidget::setCursor(this_00,&QStack_28);
    QCursor::~QCursor(&QStack_28);
  }
LAB_00416c00:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_00416c1a:
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::updateCursor()
{
#ifndef QT_NO_CURSOR
    Q_Q(QMdiSubWindow);
    if (isMacStyle(q->style()))
        return;

    if (currentOperation == None) {
        q->unsetCursor();
        return;
    }

    if (currentOperation == Move || operationMap.find(currentOperation).value().hover) {
        q->setCursor(operationMap.find(currentOperation).value().cursorShape);
        return;
    }
#endif
}